

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O2

int __thiscall Assimp::B3DImporter::ReadByte(B3DImporter *this)

{
  uint uVar1;
  pointer puVar2;
  B3DImporter *this_00;
  allocator<char> local_29;
  
  uVar1 = this->_pos;
  puVar2 = (this->_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)uVar1 <
      (ulong)((long)(this->_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
    this->_pos = uVar1 + 1;
    return (int)puVar2[uVar1];
  }
  this_00 = (B3DImporter *)&stack0xffffffffffffffd8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffd8,"EOF",&local_29);
  Fail(this_00,(string *)&stack0xffffffffffffffd8);
}

Assistant:

int B3DImporter::ReadByte(){
    if( _pos<_buf.size() ) return _buf[_pos++];
    Fail( "EOF" );
    return 0;
}